

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

void __thiscall ON_PolynomialCurve::~ON_PolynomialCurve(ON_PolynomialCurve *this)

{
  Destroy(this);
  ON_SimpleArray<ON_4dPoint>::~ON_SimpleArray(&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>);
  return;
}

Assistant:

ON_PolynomialCurve::~ON_PolynomialCurve()
{
  Destroy();
}